

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newline_string.c
# Opt level: O1

char * mpt_newline_string(int type)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  iVar1 = 2;
  if (0 < type) {
    iVar1 = type;
  }
  pcVar3 = "\r\n";
  if (iVar1 == 2) {
    pcVar3 = "\n";
  }
  pcVar2 = "\r";
  if (iVar1 != 1) {
    pcVar2 = pcVar3;
  }
  return pcVar2;
}

Assistant:

extern const char *mpt_newline_string(int type)
{
	static const char nl_unix[] = { '\n', 0 };
	static const char nl_mac[] = { '\r', 0 };
	static const char nl_net[] = { '\r', '\n', 0 };
	const char *nl = nl_net;
	
	if (type < 0 || !type) {
		type = mpt_newline_native();
	}
	if (type == MPT_ENUM(NewlineUnix)) {
		nl = nl_unix;
	}
	if (type == MPT_ENUM(NewlineMac)) {
		nl = nl_mac;
	}
	return nl;
}